

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * atomign(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  int iVar2;
  matches *pmVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  
  if (ctx->reverse != 0) {
    pmVar3 = alwaysmatches(spos);
    return pmVar3;
  }
  iVar1 = *v;
  iVar6 = iVar1 + 0x3f;
  if (-1 < iVar1) {
    iVar6 = iVar1;
  }
  iVar2 = *(int *)((long)v + 4);
  uVar5 = ~(-1L << ((byte)iVar2 & 0x3f));
  bVar4 = (byte)(iVar1 % 0x40);
  m[iVar6 >> 6] = m[iVar6 >> 6] | uVar5 << (bVar4 & 0x3f);
  if (0x40 < iVar2 + iVar1 % 0x40) {
    m[(long)(iVar6 >> 6) + 1] = m[(long)(iVar6 >> 6) + 1] | uVar5 >> (-bVar4 & 0x3f);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomign APROTO {
	if (ctx->reverse)
		return alwaysmatches(spos);
	const int *n = v;
	(void)BF(n[0], n[1]);
	return NULL;
}